

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_File * HTS_fopen_from_fn(char *name,char *opt)

{
  HTS_File *__ptr;
  FILE *pFVar1;
  
  __ptr = (HTS_File *)HTS_calloc(1,0x10);
  __ptr->type = '\0';
  pFVar1 = fopen(name,opt);
  __ptr->pointer = pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    HTS_error(0,"HTS_fopen: Cannot open %s.\n",name);
    free(__ptr);
    __ptr = (HTS_File *)0x0;
  }
  return __ptr;
}

Assistant:

HTS_File *HTS_fopen_from_fn(const char *name, const char *opt)
{
   HTS_File *fp = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));

   fp->type = HTS_FILE;
   fp->pointer = (void *) fopen(name, opt);

   if (fp->pointer == NULL) {
      HTS_error(0, "HTS_fopen: Cannot open %s.\n", name);
      HTS_free(fp);
      return NULL;
   }

   return fp;
}